

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_ElementsNoSegwitAddressFromHashTest_Test::TestBody
          (Address_ElementsNoSegwitAddressFromHashTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_938;
  Message local_930;
  Script local_928;
  string local_8f0;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_11;
  Message local_8b8;
  AddressType local_8b0 [2];
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_10;
  Message local_890;
  NetType local_888 [2];
  undefined1 local_880 [8];
  AssertionResult gtest_ar_9;
  Message local_868;
  string local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_8;
  Message local_828;
  Address local_820;
  AssertHelper local_6a8;
  Message local_6a0;
  Script local_698;
  string local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_7;
  Message local_628;
  Script local_620;
  string local_5e8;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_6;
  Message local_5b0;
  Pubkey local_5a8;
  string local_590;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_5;
  Message local_558;
  ByteData local_550;
  string local_538;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_4;
  Message local_500;
  WitnessVersion local_4f8 [2];
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_3;
  Message local_4d8;
  AddressType local_4d0 [2];
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_2;
  Message local_4b0;
  NetType local_4a8 [2];
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_1;
  Message local_488;
  string local_480;
  undefined1 local_460 [8];
  AssertionResult gtest_ar;
  Message local_448 [2];
  Address local_438;
  undefined1 local_2c0 [8];
  Address address;
  string local_140;
  undefined1 local_120 [8];
  AddressFormatData net_param;
  ByteData160 script_hash;
  Script *script;
  ScriptBuilder builder;
  ByteData160 pubkey_hash;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey pubkey;
  Address_ElementsNoSegwitAddressFromHashTest_Test *this_local;
  
  pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HashUtil::Hash160
            ((ByteData160 *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_28);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)&script);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_DUP);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_HASH160);
  cfd::core::ScriptBuilder::AppendData
            ((ScriptBuilder *)&script,
             (ByteData160 *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_EQUALVERIFY);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)&script,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build
            ((Script *)
             &script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ScriptBuilder *)&script);
  cfd::core::HashUtil::Hash160
            ((ByteData160 *)&net_param.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Script *)
             &script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,
             "{\"nettype\":\"custom\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"}",
             (allocator *)
             ((long)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  cfd::core::AddressFormatData::ConvertFromJson((AddressFormatData *)local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&address.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  cfd::core::Address::Address((Address *)local_2c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address
                (&local_438,kCfdConnectionError,kP2pkhAddress,
                 (ByteData160 *)
                 &builder.script_byte_array_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(AddressFormatData *)local_120);
      cfd::core::Address::operator=((Address *)local_2c0,&local_438);
      cfd::core::Address::~Address(&local_438);
    }
  }
  else {
    testing::Message::Message(local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x276,
               "Expected: (address = Address(NetType::kCustomChain, AddressType::kP2pkhAddress, pubkey_hash, net_param)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_448);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_480,(Address *)local_2c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_460,"\"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3\"",
             "address.GetAddress().c_str()","2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",pcVar2);
  std::__cxx11::string::~string((string *)&local_480);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x278,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  local_4a8[1] = 5;
  local_4a8[0] = cfd::core::Address::GetNetType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_4a0,"NetType::kCustomChain","address.GetNetType()",
             local_4a8 + 1,local_4a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x279,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  local_4d0[1] = 2;
  local_4d0[0] = cfd::core::Address::GetAddressType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_4c8,"AddressType::kP2pkhAddress","address.GetAddressType()",
             local_4d0 + 1,local_4d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  local_4f8[1] = 0xffffffff;
  local_4f8[0] = cfd::core::Address::GetWitnessVersion((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((EqHelper<false> *)local_4f0,"WitnessVersion::kVersionNone",
             "address.GetWitnessVersion()",local_4f8 + 1,local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x27b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  cfd::core::Address::GetHash(&local_550,(Address *)local_2c0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_538,&local_550);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_518,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_538);
  cfd::core::ByteData::~ByteData(&local_550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x27d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  cfd::core::Address::GetPubkey(&local_5a8,(Address *)local_2c0);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_590,&local_5a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_570,"\"\"","address.GetPubkey().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_590);
  cfd::core::Pubkey::~Pubkey(&local_5a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_5b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x27e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_5b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_5b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  cfd::core::Address::GetScript(&local_620,(Address *)local_2c0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_5e8,&local_620);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5c8,"\"\"","address.GetScript().GetHex().c_str()","",pcVar2);
  std::__cxx11::string::~string((string *)&local_5e8);
  cfd::core::Script::~Script(&local_620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x27f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  cfd::core::Address::GetLockingScript(&local_698,(Address *)local_2c0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_660,&local_698);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_640,"\"76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac\"",
             "address.GetLockingScript().GetHex().c_str()",
             "76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",pcVar2);
  std::__cxx11::string::~string((string *)&local_660);
  cfd::core::Script::~Script(&local_698);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x281,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::Address
                (&local_820,kCfdConnectionError,kP2shAddress,
                 (ByteData160 *)&net_param.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (AddressFormatData *)local_120);
      cfd::core::Address::operator=((Address *)local_2c0,&local_820);
      cfd::core::Address::~Address(&local_820);
    }
  }
  else {
    testing::Message::Message(&local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x284,
               "Expected: (address = Address(NetType::kCustomChain, AddressType::kP2shAddress, script_hash, net_param)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_828);
  }
  cfd::core::Address::GetAddress_abi_cxx11_(&local_860,(Address *)local_2c0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_840,"\"XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA\"",
             "address.GetAddress().c_str()","XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA",pcVar2);
  std::__cxx11::string::~string((string *)&local_860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x286,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  local_888[1] = 5;
  local_888[0] = cfd::core::Address::GetNetType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_880,"NetType::kCustomChain","address.GetNetType()",
             local_888 + 1,local_888);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_880);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x287,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_890);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  local_8b0[1] = 1;
  local_8b0[0] = cfd::core::Address::GetAddressType((Address *)local_2c0);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_8a8,"AddressType::kP2shAddress","address.GetAddressType()",
             local_8b0 + 1,local_8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x288,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  cfd::core::Address::GetLockingScript(&local_928,(Address *)local_2c0);
  cfd::core::Script::GetHex_abi_cxx11_(&local_8f0,&local_928);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8d0,"\"a914be8f7ae2233fc122be82f2cf9fe3cc2c6196218a87\"",
             "address.GetLockingScript().GetHex().c_str()",
             "a914be8f7ae2233fc122be82f2cf9fe3cc2c6196218a87",pcVar2);
  std::__cxx11::string::~string((string *)&local_8f0);
  cfd::core::Script::~Script(&local_928);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_930);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_938,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x28a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_938,&local_930);
    testing::internal::AssertHelper::~AssertHelper(&local_938);
    testing::Message::~Message(&local_930);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  cfd::core::Address::~Address((Address *)local_2c0);
  cfd::core::AddressFormatData::~AddressFormatData((AddressFormatData *)local_120);
  cfd::core::ByteData160::~ByteData160
            ((ByteData160 *)&net_param.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Script::~Script
            ((Script *)
             &script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&script);
  cfd::core::ByteData160::~ByteData160
            ((ByteData160 *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(Address, ElementsNoSegwitAddressFromHashTest) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ByteData160 pubkey_hash = HashUtil::Hash160(pubkey);
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(pubkey_hash);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  const Script &script = builder.Build();
  ByteData160 script_hash = HashUtil::Hash160(script);
  AddressFormatData net_param = AddressFormatData::ConvertFromJson(
      "{\"nettype\":\"custom\",\"p2pkh\":\"eb\",\"p2sh\":\"4b\",\"bech32\":\"ert\"}");

  Address address;
  EXPECT_NO_THROW((address = Address(NetType::kCustomChain,
                   AddressType::kP2pkhAddress, pubkey_hash, net_param)));
  EXPECT_STREQ("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kCustomChain, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersionNone, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address(NetType::kCustomChain,
                   AddressType::kP2shAddress, script_hash, net_param)));
  EXPECT_STREQ("XUiq7kxdkiB3AXNkKW9YaWLLGb1WBo9xcA",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kCustomChain, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());
  EXPECT_STREQ("a914be8f7ae2233fc122be82f2cf9fe3cc2c6196218a87",
               address.GetLockingScript().GetHex().c_str());
}